

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execution.hpp
# Opt level: O3

void __thiscall diy::Master::ProcessBlock::operator()(ProcessBlock *this)

{
  deque<int,_std::allocator<int>_> *pdVar1;
  _Map_pointer ppiVar2;
  _Map_pointer ppiVar3;
  _Elt_pointer piVar4;
  pointer puVar5;
  _Head_base<0UL,_diy::Master::BaseCommand_*,_false> _Var6;
  void *pvVar7;
  Link *pLVar8;
  int iVar9;
  mapped_type *this_00;
  ulong uVar10;
  ulong uVar11;
  uint *puVar12;
  pointer puVar13;
  long lVar14;
  Master *pMVar15;
  size_t *psVar16;
  pointer puVar17;
  void *pvVar18;
  byte bVar19;
  int i;
  vector<int,_std::allocator<int>_> local;
  int gid;
  uint local_1ac;
  vector<int,_std::allocator<int>_> local_1a8;
  int local_184;
  ProcessBlock *local_180;
  pointer local_178;
  mapped_type *local_170;
  critical_resource<int,_tthread::fast_mutex> *local_168;
  undefined1 auStack_160 [24];
  _Rb_tree_node_base local_148;
  size_t local_128 [2];
  _Rb_tree_node_base local_118;
  size_t local_f8;
  CollectivesList *local_f0;
  cothread_t pvStack_e8;
  bool local_e0;
  void *local_d8;
  Link *local_d0;
  critical_resource<int,_tthread::fast_mutex> *local_c0;
  Master *pMStack_b8;
  IExchangeInfo *local_b0;
  _Rb_tree_node_base local_a0;
  size_t local_80 [2];
  _Rb_tree_node_base local_70;
  size_t local_50;
  CollectivesList *local_48;
  cothread_t pvStack_40;
  bool local_38;
  
  local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_180 = this;
  do {
    local_168 = this->idx;
    auStack_160._0_8_ = &local_168->m_;
    auStack_160._8_8_ = auStack_160._8_8_ & 0xffffffffffffff00;
    std::unique_lock<tthread::fast_mutex>::lock((unique_lock<tthread::fast_mutex> *)auStack_160);
    auStack_160[8] = 1;
    uVar10 = (ulong)local_168->x_;
    local_168->x_ = local_168->x_ + 1;
    if ((Master *)auStack_160._0_8_ != (Master *)0x0) {
      LOCK();
      *(int *)&(((vector<diy::Link_*,_std::allocator<diy::Link_*>_> *)auStack_160._0_8_)->
               super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>)._M_impl.
               super__Vector_impl_data._M_start = 0;
      UNLOCK();
    }
    pdVar1 = this->blocks;
    ppiVar2 = (pdVar1->super__Deque_base<int,_std::allocator<int>_>)._M_impl.super__Deque_impl_data.
              _M_finish._M_node;
    ppiVar3 = (pdVar1->super__Deque_base<int,_std::allocator<int>_>)._M_impl.super__Deque_impl_data.
              _M_start._M_node;
    piVar4 = (pdVar1->super__Deque_base<int,_std::allocator<int>_>)._M_impl.super__Deque_impl_data.
             _M_start._M_cur;
    if (((long)(pdVar1->super__Deque_base<int,_std::allocator<int>_>)._M_impl.super__Deque_impl_data
               ._M_start._M_last - (long)piVar4 >> 2) +
        ((long)(pdVar1->super__Deque_base<int,_std::allocator<int>_>)._M_impl.super__Deque_impl_data
               ._M_finish._M_cur -
         (long)(pdVar1->super__Deque_base<int,_std::allocator<int>_>)._M_impl.super__Deque_impl_data
               ._M_finish._M_first >> 2) +
        ((((ulong)((long)ppiVar2 - (long)ppiVar3) >> 3) - 1) + (ulong)(ppiVar2 == (_Map_pointer)0x0)
        ) * 0x80 <= uVar10) {
      if (local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      return;
    }
    uVar11 = ((long)piVar4 -
              (long)(pdVar1->super__Deque_base<int,_std::allocator<int>_>)._M_impl.
                    super__Deque_impl_data._M_start._M_first >> 2) + uVar10;
    if ((long)uVar11 < 0) {
      uVar10 = (long)uVar11 >> 7;
LAB_00111c90:
      puVar12 = (uint *)(ppiVar3[uVar10] + uVar11 + uVar10 * -0x80);
    }
    else {
      if (0x7f < uVar11) {
        uVar10 = uVar11 >> 7;
        goto LAB_00111c90;
      }
      puVar12 = (uint *)(piVar4 + uVar10);
    }
    local_1ac = *puVar12;
    uVar10 = (ulong)(int)local_1ac;
    pMVar15 = this->master;
    local_184 = (pMVar15->gids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar10];
    if ((pMVar15->blocks_).elements_.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
        super__Vector_impl_data._M_start[uVar10] != (void *)0x0) {
      if ((long)local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start >> 2 == (long)this->local_limit) {
        unload(pMVar15,&local_1a8);
      }
      if (local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_1a8,
                   (iterator)
                   local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)&local_1ac);
        uVar10 = (ulong)local_1ac;
      }
      else {
        uVar10 = (ulong)local_1ac;
        *local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_1ac;
        local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
    }
    pMVar15 = this->master;
    puVar17 = (pMVar15->commands_).
              super__Vector_base<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>,_std::allocator<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar5 = (pMVar15->commands_).
             super__Vector_base<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>,_std::allocator<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar17 == puVar5) {
      bVar19 = 1;
    }
    else {
      do {
        puVar13 = puVar17 + 1;
        _Var6._M_head_impl =
             (puVar17->_M_t).
             super___uniq_ptr_impl<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>
             ._M_t.
             super__Tuple_impl<0UL,_diy::Master::BaseCommand_*,_std::default_delete<diy::Master::BaseCommand>_>
             .super__Head_base<0UL,_diy::Master::BaseCommand_*,_false>._M_head_impl;
        iVar9 = (*(_Var6._M_head_impl)->_vptr_BaseCommand[3])
                          (_Var6._M_head_impl,uVar10 & 0xffffffff,this->master);
        bVar19 = (byte)iVar9;
        puVar17 = puVar13;
      } while ((bVar19 & puVar13 != puVar5) != 0);
      pMVar15 = this->master;
    }
    local_170 = std::
                map<int,_diy::Master::IncomingRound,_std::less<int>,_std::allocator<std::pair<const_int,_diy::Master::IncomingRound>_>_>
                ::operator[](&pMVar15->incoming_,&pMVar15->exchange_round_);
    pMVar15 = this->master;
    lVar14 = (long)(int)local_1ac;
    if ((pMVar15->blocks_).elements_.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
        super__Vector_impl_data._M_start[lVar14] == (void *)0x0) {
      if (bVar19 == 0) {
        if ((long)local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2 == (long)this->local_limit) {
          unload(pMVar15,&local_1a8);
          pMVar15 = this->master;
          lVar14 = (long)(int)local_1ac;
        }
        Collection::load(&pMVar15->blocks_,local_1ac);
        load_incoming(pMVar15,(pMVar15->gids_).super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start[lVar14]);
        load_outgoing(pMVar15,(pMVar15->gids_).super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start[lVar14]);
        if (local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_1a8,
                     (iterator)
                     local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)&local_1ac);
        }
        else {
          *local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = local_1ac;
          local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_1a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
      }
      else {
        load_incoming(pMVar15,(pMVar15->gids_).super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start[lVar14]);
        load_outgoing(pMVar15,(pMVar15->gids_).super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start[lVar14]);
      }
    }
    puVar17 = (this->master->commands_).
              super__Vector_base<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>,_std::allocator<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_178 = (this->master->commands_).
                super__Vector_base<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>,_std::allocator<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar17 != local_178) {
      do {
        pMVar15 = this->master;
        lVar14 = (long)(int)local_1ac;
        if (bVar19 == 0) {
          pvVar18 = (pMVar15->blocks_).elements_.super__Vector_base<void_*,_std::allocator<void_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar14];
        }
        else {
          pvVar18 = (void *)0x0;
        }
        _Var6._M_head_impl =
             (puVar17->_M_t).
             super___uniq_ptr_impl<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>
             ._M_t.
             super__Tuple_impl<0UL,_diy::Master::BaseCommand_*,_std::default_delete<diy::Master::BaseCommand>_>
             .super__Head_base<0UL,_diy::Master::BaseCommand_*,_false>._M_head_impl;
        Proxy::Proxy((Proxy *)&local_c0,pMVar15,
                     (pMVar15->gids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar14],(IExchangeInfo *)0x0);
        pvVar7 = (pMVar15->blocks_).elements_.super__Vector_base<void_*,_std::allocator<void_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar14];
        pLVar8 = (pMVar15->links_).super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar14];
        auStack_160._8_8_ = local_b0;
        local_168 = local_c0;
        auStack_160._0_8_ = pMStack_b8;
        if (local_a0._M_parent == (_Base_ptr)0x0) {
          local_148._M_parent = (_Base_ptr)0x0;
          local_148._M_color = _S_red;
          local_148._M_left = &local_148;
          psVar16 = local_128;
          local_148._M_right = local_148._M_left;
        }
        else {
          local_148._M_parent = local_a0._M_parent;
          (local_a0._M_parent)->_M_parent = &local_148;
          local_128[0] = local_80[0];
          local_a0._M_parent = (_Base_ptr)0x0;
          psVar16 = local_80;
          local_148._M_left = local_a0._M_left;
          local_148._M_right = local_a0._M_right;
          local_148._M_color = local_a0._M_color;
          local_a0._M_left = &local_a0;
          local_a0._M_right = &local_a0;
        }
        *psVar16 = 0;
        if (local_70._M_parent == (_Base_ptr)0x0) {
          local_118._M_parent = (_Base_ptr)0x0;
          local_118._M_color = _S_red;
          local_118._M_left = &local_118;
          psVar16 = &local_f8;
          local_118._M_right = local_118._M_left;
        }
        else {
          local_118._M_parent = local_70._M_parent;
          (local_70._M_parent)->_M_parent = &local_118;
          local_f8 = local_50;
          local_70._M_parent = (_Base_ptr)0x0;
          psVar16 = &local_50;
          local_118._M_left = local_70._M_left;
          local_118._M_right = local_70._M_right;
          local_118._M_color = local_70._M_color;
          local_70._M_left = &local_70;
          local_70._M_right = &local_70;
        }
        *psVar16 = 0;
        local_e0 = local_38;
        local_f0 = local_48;
        pvStack_e8 = pvStack_40;
        local_d8 = pvVar7;
        local_d0 = pLVar8;
        Proxy::~Proxy((Proxy *)&local_c0);
        (*(_Var6._M_head_impl)->_vptr_BaseCommand[2])
                  (_Var6._M_head_impl,pvVar18,(Proxy *)&local_168);
        Proxy::~Proxy((Proxy *)&local_168);
        this_00 = std::
                  map<int,_diy::concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>_>
                  ::operator[](&local_170->map,&local_184);
        concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
        ::clear(this_00);
        puVar17 = puVar17 + 1;
        this = local_180;
      } while (puVar17 != local_178);
    }
    if (bVar19 != 0) {
      pMVar15 = this->master;
      lVar14 = (long)(int)local_1ac;
      if ((pMVar15->blocks_).elements_.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
          super__Vector_impl_data._M_start[lVar14] == (void *)0x0) {
        unload_incoming(pMVar15,(pMVar15->gids_).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start[lVar14]);
        unload_outgoing(pMVar15,(pMVar15->gids_).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start[lVar14]);
      }
    }
  } while( true );
}

Assistant:

void    operator()()
  {
    master.log->debug("Processing with thread: {}",  this_thread::get_id());

    std::vector<int>      local;
    do
    {
      int cur = (*idx.access())++;

      if ((size_t)cur >= blocks.size())
          return;

      int i   = blocks[cur];
      int gid = master.gid(i);
      stats::Annotation::Guard g( stats::Annotation("diy.block").set(gid) );

      if (master.block(i))
      {
          if (local.size() == (size_t)local_limit)
              master.unload(local);
          local.push_back(i);
      }

      master.log->debug("Processing block: {}", gid);

      bool skip = all_skip(i);

      IncomingQueuesMap &current_incoming = master.incoming_[master.exchange_round_].map;

      if (master.block(i) == 0)             // block unloaded
      {
          if (skip)
              master.load_queues(i);        // even though we are skipping the block, the queues might be necessary
          else
          {
              if (local.size() == (size_t)local_limit)      // reached the local limit
                  master.unload(local);

              master.load(i);
              local.push_back(i);
          }
      }

      for (auto& cmd : master.commands_)
      {
          cmd->execute(skip ? 0 : master.block(i), master.proxy(i));

          // no longer need them, so get rid of them
          current_incoming[gid].clear();
      }

      if (skip && master.block(i) == 0)
          master.unload_queues(i);    // even though we are skipping the block, the queues might be necessary
    } while(true);
  }